

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferIncompleteLayereTargetsCase::iterate
          (FramebufferIncompleteLayereTargetsCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ScopedLogSection section;
  Texture texture1;
  Texture texture0;
  Framebuffer fbo;
  Enum<int,_2UL> local_1b0;
  MessageBuilder local_1a0;
  
  iVar3 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pTVar2 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"LayerAndNonLayer",(allocator<char> *)&texture0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fbo,"Layered and non-layered",(allocator<char> *)&texture1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1a0,(string *)&fbo);
  std::__cxx11::string::~string((string *)&fbo);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&fbo,((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&texture0,
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&texture1,
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture0.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce0,texture0.super_ObjectWrapper.m_object,0);
  glu::CallLogWrapper::glFramebufferTextureLayer
            (&gl,0x8ca9,0x8ce1,texture1.super_ObjectWrapper.m_object,0,0);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1435);
  GVar4 = glu::CallLogWrapper::glCheckFramebufferStatus(&gl,0x8ca9);
  local_1a0.m_log =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Framebuffer status: ");
  local_1b0.m_getName = glu::getFramebufferStatusName;
  local_1b0.m_value = GVar4;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (GVar4 != 0x8da8) {
    local_1a0.m_log =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ");
    local_1b0.m_getName = glu::getFramebufferStatusName;
    local_1b0.m_value = GVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"DifferentTarget",(allocator<char> *)&texture0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fbo,"Different target",(allocator<char> *)&texture1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1a0,(string *)&fbo);
  std::__cxx11::string::~string((string *)&fbo);
  std::__cxx11::string::~string((string *)&local_1a0);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&fbo,((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&texture0,
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&texture1,
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c1a,texture0.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x8c1a,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glBindTexture(&gl,0x806f,texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexImage3D(&gl,0x806f,0,0x8058,0x20,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(&gl,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce0,texture0.super_ObjectWrapper.m_object,0);
  glu::CallLogWrapper::glFramebufferTexture
            (&gl,0x8ca9,0x8ce1,texture1.super_ObjectWrapper.m_object,0);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar4,"setup fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1457);
  GVar4 = glu::CallLogWrapper::glCheckFramebufferStatus(&gl,0x8ca9);
  local_1a0.m_log =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Framebuffer status: ");
  local_1b0.m_getName = glu::getFramebufferStatusName;
  local_1b0.m_value = GVar4;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (GVar4 != 0x8da8) {
    local_1a0.m_log =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got ");
    local_1b0.m_getName = glu::getFramebufferStatusName;
    local_1b0.m_value = GVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid layer count");
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

FramebufferIncompleteLayereTargetsCase::IterateResult FramebufferIncompleteLayereTargetsCase::iterate (void)
{
	glu::CallLogWrapper gl(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "LayerAndNonLayer", "Layered and non-layered");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture1);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "DifferentTarget", "Different target");
		const glu::Framebuffer		fbo				(m_context.getRenderContext());
		const glu::Texture			texture0		(m_context.getRenderContext());
		const glu::Texture			texture1		(m_context.getRenderContext());

		glw::GLint					fboStatus;

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *texture0);
		gl.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindTexture(GL_TEXTURE_3D, *texture1);
		gl.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 32, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, *texture0, 0);
		gl.glFramebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, *texture1, 0);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup fbo");

		fboStatus = gl.glCheckFramebufferStatus(GL_DRAW_FRAMEBUFFER);
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer status: " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;

		if (fboStatus != GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS, got " << glu::getFramebufferStatusStr(fboStatus) << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid layer count");
		}
	}

	return STOP;
}